

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::Search(ON_RTree *this,double *a_min,double *a_max,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  bool bVar1;
  ON_RTreeBBox rect;
  ON_RTreeSearchResultCallback local_48;
  ON_RTreeBBox local_38;
  
  if (this->m_root != (ON_RTreeNode *)0x0) {
    local_38.m_min[2] = a_min[2];
    local_38.m_min[0] = *a_min;
    local_38.m_min[1] = a_min[1];
    local_38.m_max[0] = *a_max;
    local_38.m_max[1] = a_max[1];
    local_38.m_max[2] = a_max[2];
    local_48.m_context = a_context;
    local_48.m_resultCallback = a_resultCallback;
    bVar1 = SearchHelper(this->m_root,&local_38,&local_48);
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_RTree::Search(
  const double a_min[ON_RTree_NODE_DIM], const double a_max[ON_RTree_NODE_DIM], 
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_data),
  void* a_context
  ) const
{
  if ( 0 == m_root )
    return false;

  ON_RTreeBBox rect;
  memcpy(rect.m_min,a_min,sizeof(rect.m_min));
  memcpy(rect.m_max,a_max,sizeof(rect.m_max));
  return Search( &rect, a_resultCallback, a_context );
}